

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::RandomShaderCase::iterate(RandomShaderCase *this)

{
  RenderContext *pRVar1;
  ConstValueRangeAccess valueRange;
  uint uVar2;
  GLuint index;
  deUint64 log_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  deBool dVar11;
  char *pcVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PixelFormat *pPVar13;
  pointer pVVar14;
  vector<float,_std::allocator<float>_> *this_00;
  const_reference pointer;
  pointer pVVar15;
  Variable *pVVar16;
  MessageBuilder *pMVar17;
  pointer ppVar18;
  Texture2D *texture_00;
  pointer ppVar19;
  TextureCube *texture_01;
  size_type sVar20;
  reference indices;
  TextureFormat TVar21;
  ConstValueAccess CVar22;
  ConstValueAccess value;
  ConstValueAccess value_00;
  ConstPixelBufferAccess local_940;
  ConstPixelBufferAccess local_918;
  undefined1 local_8ed;
  float local_8ec;
  undefined1 local_8e8 [3];
  bool imagesOk;
  float threshold;
  ConstPixelBufferAccess local_8c0;
  PixelBufferAccess local_898;
  PixelBufferAccess local_870;
  TextureFormat local_848;
  undefined1 local_840 [8];
  TextureLevel readBuf;
  ChannelOrder local_810;
  Sampler local_7fc;
  TextureCube *local_7c0;
  TextureCube *texture_1;
  iterator iStack_7b0;
  int unitNdx_1;
  __normal_iterator<std::pair<int,_const_glu::TextureCube_*>_*,_std::vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>_>
  local_7a8;
  __normal_iterator<const_std::pair<int,_const_glu::TextureCube_*>_*,_std::vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>_>
  local_7a0;
  const_iterator i_1;
  Sampler local_78c;
  Texture2D *local_750;
  Texture2D *texture;
  iterator iStack_740;
  int unitNdx;
  __normal_iterator<std::pair<int,_const_glu::Texture2D_*>_*,_std::vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>_>
  local_738;
  __normal_iterator<const_std::pair<int,_const_glu::Texture2D_*>_*,_std::vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>_>
  local_730;
  const_iterator i;
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  texCubeBindings;
  vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
  tex2DBindings;
  char *local_6d0;
  MessageBuilder local_6c8;
  uint local_544;
  iterator iStack_540;
  GLint location_1;
  __normal_iterator<rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_538;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_530;
  const_iterator uniformIter;
  ConstValueRangeAccess local_520;
  char *local_508;
  MessageBuilder local_500;
  GLuint local_37c;
  iterator iStack_378;
  GLint location;
  __normal_iterator<deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
  local_370;
  __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
  local_368;
  const_iterator attribIter;
  undefined1 local_338 [8];
  ProgramExecutor executor;
  undefined1 local_2a0 [8];
  TextureLevel reference;
  undefined1 local_270 [8];
  TextureLevel rendered;
  bool hasAlpha;
  int viewportY;
  int viewportX;
  int viewportHeight;
  int viewportWidth;
  Random rnd;
  string local_218;
  allocator<char> local_1e1;
  string local_1e0;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram program;
  TestLog *log;
  RandomShaderCase *this_local;
  
  program.m_program.m_info.linkTimeUs =
       (deUint64)tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  pRVar1 = this->m_renderCtx;
  pcVar12 = rsg::Shader::getSource(&this->m_vertexShader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar12,&local_1e1);
  pcVar12 = rsg::Shader::getSource(&this->m_fragmentShader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,pcVar12,(allocator<char> *)((long)&rnd.m_rnd.w + 3));
  glu::makeVtxFragSources(&local_1c0,&local_1e0,&local_218);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,pRVar1,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rnd.m_rnd.w + 3));
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  glu::operator<<((TestLog *)program.m_program.m_info.linkTimeUs,(ShaderProgram *)local_f0);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
  if (bVar3) {
    de::Random::Random((Random *)&viewportHeight,(this->m_parameters).seed);
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
    iVar4 = de::min<int>(0x40,iVar4);
    iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar5));
    iVar5 = de::min<int>(0x40,iVar5);
    iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar6));
    iVar6 = de::Random::getInt((Random *)&viewportHeight,0,iVar6 - iVar4);
    iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar7));
    iVar7 = de::Random::getInt((Random *)&viewportHeight,0,iVar7 - iVar5);
    iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar13 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar8));
    rendered.m_data.m_cap._7_1_ = 0 < pPVar13->alphaBits;
    tcu::TextureFormat::TextureFormat
              ((TextureFormat *)&reference.m_data.m_cap,rendered.m_data.m_cap._7_1_ + RGB,UNORM_INT8
              );
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_270,(TextureFormat *)&reference.m_data.m_cap,iVar4,iVar5,1);
    tcu::TextureFormat::TextureFormat
              ((TextureFormat *)
               &executor.m_samplersCube._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (rendered.m_data.m_cap._7_1_ & 1) + RGB,UNORM_INT8);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_2a0,
               (TextureFormat *)
               &executor.m_samplersCube._M_t._M_impl.super__Rb_tree_header._M_node_count,iVar4,iVar5
               ,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&attribIter,(TextureLevel *)local_2a0);
    rsg::ProgramExecutor::ProgramExecutor
              ((ProgramExecutor *)local_338,(PixelBufferAccess *)&attribIter,this->m_gridWidth,
               this->m_gridHeight);
    do {
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
      glwUseProgram(dVar9);
      GVar10 = glwGetError();
      glu::checkError(GVar10,"glUseProgram(program.getProgram())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                      ,0x1e6);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    local_370._M_current =
         (VertexArray *)
         std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::begin
                   (&this->m_vertexArrays);
    __gnu_cxx::
    __normal_iterator<deqp::gls::VertexArray_const*,std::vector<deqp::gls::VertexArray,std::allocator<deqp::gls::VertexArray>>>
    ::__normal_iterator<deqp::gls::VertexArray*>
              ((__normal_iterator<deqp::gls::VertexArray_const*,std::vector<deqp::gls::VertexArray,std::allocator<deqp::gls::VertexArray>>>
                *)&local_368,&local_370);
    while( true ) {
      iStack_378 = std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::end
                             (&this->m_vertexArrays);
      bVar3 = __gnu_cxx::operator!=(&local_368,&stack0xfffffffffffffc88);
      if (!bVar3) break;
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
      pVVar14 = __gnu_cxx::
                __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
                ::operator->(&local_368);
      pcVar12 = VertexArray::getName(pVVar14);
      local_37c = glwGetAttribLocation(dVar9,pcVar12);
      tcu::TestLog::operator<<
                (&local_500,(TestLog *)program.m_program.m_info.linkTimeUs,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar17 = tcu::MessageBuilder::operator<<(&local_500,(char (*) [11])"attribute[");
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(int *)&local_37c);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [4])"]: ");
      pVVar14 = __gnu_cxx::
                __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
                ::operator->(&local_368);
      local_508 = VertexArray::getName(pVVar14);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_508);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [4])0xad66d6);
      pVVar14 = __gnu_cxx::
                __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
                ::operator->(&local_368);
      VertexArray::getValueRange(&local_520,pVVar14);
      valueRange.m_min = local_520.m_min;
      valueRange.m_type = local_520.m_type;
      valueRange.m_max = local_520.m_max;
      pMVar17 = anon_unknown_5::operator<<(pMVar17,valueRange);
      tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_500);
      index = local_37c;
      if (-1 < (int)local_37c) {
        pVVar14 = __gnu_cxx::
                  __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
                  ::operator->(&local_368);
        iVar8 = VertexArray::getNumComponents(pVVar14);
        pVVar14 = __gnu_cxx::
                  __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
                  ::operator->(&local_368);
        this_00 = VertexArray::getVertices(pVVar14);
        pointer = std::vector<float,_std::allocator<float>_>::operator[](this_00,0);
        glwVertexAttribPointer(index,iVar8,0x1406,'\0',0,pointer);
        glwEnableVertexAttribArray(local_37c);
      }
      uniformIter._M_current =
           (VariableValue *)
           __gnu_cxx::
           __normal_iterator<const_deqp::gls::VertexArray_*,_std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>_>
           ::operator++(&local_368,0);
    }
    GVar10 = glwGetError();
    glu::checkError(GVar10,"After attribute setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1f6);
    local_538._M_current =
         (VariableValue *)
         std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::begin
                   (&this->m_uniforms);
    __gnu_cxx::
    __normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
    ::__normal_iterator<rsg::VariableValue*>
              ((__normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
                *)&local_530,&local_538);
    while( true ) {
      iStack_540 = std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::end
                             (&this->m_uniforms);
      bVar3 = __gnu_cxx::operator!=(&local_530,&stack0xfffffffffffffac0);
      if (!bVar3) break;
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
      pVVar15 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                ::operator->(&local_530);
      pVVar16 = rsg::VariableValue::getVariable(pVVar15);
      pcVar12 = rsg::Variable::getName(pVVar16);
      local_544 = glwGetUniformLocation(dVar9,pcVar12);
      tcu::TestLog::operator<<
                (&local_6c8,(TestLog *)program.m_program.m_info.linkTimeUs,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar17 = tcu::MessageBuilder::operator<<(&local_6c8,(char (*) [9])"uniform[");
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(int *)&local_544);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [4])"]: ");
      pVVar15 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                ::operator->(&local_530);
      pVVar16 = rsg::VariableValue::getVariable(pVVar15);
      local_6d0 = rsg::Variable::getName(pVVar16);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_6d0);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [4])0xad66d6);
      pVVar15 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                ::operator->(&local_530);
      CVar22 = rsg::VariableValue::getValue(pVVar15);
      value.m_type = CVar22.m_value;
      value.m_value = (Scalar *)CVar22.m_type;
      pMVar17 = anon_unknown_5::operator<<
                          ((anon_unknown_5 *)pMVar17,(MessageBuilder *)CVar22.m_type,value);
      tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c8);
      uVar2 = local_544;
      if (-1 < (int)local_544) {
        pVVar15 = __gnu_cxx::
                  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                  ::operator->(&local_530);
        CVar22 = rsg::VariableValue::getValue(pVVar15);
        value_00.m_type = CVar22.m_value;
        value_00.m_value = (Scalar *)CVar22.m_type;
        anon_unknown_5::setUniformValue((anon_unknown_5 *)(ulong)uVar2,(int)CVar22.m_type,value_00);
      }
      __gnu_cxx::
      __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
      ::operator++(&local_530,0);
    }
    GVar10 = glwGetError();
    glu::checkError(GVar10,"After uniform setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x202);
    TextureManager::getBindings2D
              ((vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                *)&texCubeBindings.
                   super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_texManager);
    TextureManager::getBindingsCube
              ((vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                *)&i,&this->m_texManager);
    local_738._M_current =
         (pair<int,_const_glu::Texture2D_*> *)
         std::
         vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
         ::begin((vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                  *)&texCubeBindings.
                     super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::pair<int,glu::Texture2D_const*>const*,std::vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>>
    ::__normal_iterator<std::pair<int,glu::Texture2D_const*>*>
              ((__normal_iterator<std::pair<int,glu::Texture2D_const*>const*,std::vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>>
                *)&local_730,&local_738);
    while( true ) {
      iStack_740 = std::
                   vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                   ::end((vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                          *)&texCubeBindings.
                             super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_730,&stack0xfffffffffffff8c0);
      if (!bVar3) break;
      ppVar18 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_const_glu::Texture2D_*>_*,_std::vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>_>
                ::operator->(&local_730);
      texture._4_4_ = ppVar18->first;
      ppVar18 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_const_glu::Texture2D_*>_*,_std::vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>_>
                ::operator->(&local_730);
      local_750 = ppVar18->second;
      glwActiveTexture(texture._4_4_ + 0x84c0);
      dVar9 = glu::Texture2D::getGLTexture(local_750);
      glwBindTexture(0xde1,dVar9);
      iVar8 = texture._4_4_;
      texture_00 = glu::Texture2D::getRefTexture(local_750);
      glu::mapGLSampler(&local_78c,0x812f,0x812f,0x2601,0x2601);
      rsg::ProgramExecutor::setTexture((ProgramExecutor *)local_338,iVar8,texture_00,&local_78c);
      i_1._M_current =
           (pair<int,_const_glu::TextureCube_*> *)
           __gnu_cxx::
           __normal_iterator<const_std::pair<int,_const_glu::Texture2D_*>_*,_std::vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>_>
           ::operator++(&local_730,0);
    }
    GVar10 = glwGetError();
    glu::checkError(GVar10,"After 2D texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x212);
    local_7a8._M_current =
         (pair<int,_const_glu::TextureCube_*> *)
         std::
         vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
         ::begin((vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                  *)&i);
    __gnu_cxx::
    __normal_iterator<std::pair<int,glu::TextureCube_const*>const*,std::vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>>
    ::__normal_iterator<std::pair<int,glu::TextureCube_const*>*>
              ((__normal_iterator<std::pair<int,glu::TextureCube_const*>const*,std::vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>>
                *)&local_7a0,&local_7a8);
    while( true ) {
      iStack_7b0 = std::
                   vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                   ::end((vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                          *)&i);
      bVar3 = __gnu_cxx::operator!=(&local_7a0,&stack0xfffffffffffff850);
      if (!bVar3) break;
      ppVar19 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_const_glu::TextureCube_*>_*,_std::vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>_>
                ::operator->(&local_7a0);
      texture_1._4_4_ = ppVar19->first;
      ppVar19 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_const_glu::TextureCube_*>_*,_std::vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>_>
                ::operator->(&local_7a0);
      local_7c0 = ppVar19->second;
      glwActiveTexture(texture_1._4_4_ + 0x84c0);
      dVar9 = glu::TextureCube::getGLTexture(local_7c0);
      glwBindTexture(0x8513,dVar9);
      iVar8 = texture_1._4_4_;
      texture_01 = glu::TextureCube::getRefTexture(local_7c0);
      glu::mapGLSampler(&local_7fc,0x812f,0x812f,0x2601,0x2601);
      rsg::ProgramExecutor::setTexture((ProgramExecutor *)local_338,iVar8,texture_01,&local_7fc);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_const_glu::TextureCube_*>_*,_std::vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>_>
      ::operator++(&local_7a0,0);
    }
    GVar10 = glwGetError();
    glu::checkError(GVar10,"After cubemap setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x21e);
    glwViewport(iVar6,iVar7,iVar4,iVar5);
    sVar20 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_indices);
    indices = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        (&this->m_indices,0);
    glwDrawElements(4,(GLsizei)sVar20,0x1403,indices);
    glwFlush();
    GVar10 = glwGetError();
    glu::checkError(GVar10,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x224);
    rsg::ProgramExecutor::execute
              ((ProgramExecutor *)local_338,&this->m_vertexShader,&this->m_fragmentShader,
               &this->m_uniforms);
    TVar21 = tcu::TextureLevel::getFormat((TextureLevel *)local_270);
    local_810 = TVar21.order;
    bVar3 = true;
    if (local_810 == RGBA) {
      readBuf.m_data.m_cap = (size_t)tcu::TextureLevel::getFormat((TextureLevel *)local_270);
      bVar3 = readBuf.m_data.m_cap._4_4_ != UNORM_INT8;
    }
    if (bVar3) {
      tcu::TextureFormat::TextureFormat(&local_848,RGBA,UNORM_INT8);
      iVar4 = tcu::TextureLevel::getWidth((TextureLevel *)local_270);
      iVar5 = tcu::TextureLevel::getHeight((TextureLevel *)local_270);
      tcu::TextureLevel::TextureLevel((TextureLevel *)local_840,&local_848,iVar4,iVar5,1);
      pRVar1 = this->m_renderCtx;
      tcu::TextureLevel::getAccess(&local_870,(TextureLevel *)local_840);
      glu::readPixels(pRVar1,iVar6,iVar7,&local_870);
      GVar10 = glwGetError();
      glu::checkError(GVar10,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                      ,0x22e);
      tcu::PixelBufferAccess::PixelBufferAccess(&local_898,(TextureLevel *)local_270);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_8c0,(TextureLevel *)local_840);
      tcu::copy((EVP_PKEY_CTX *)&local_898,(EVP_PKEY_CTX *)&local_8c0);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_840);
    }
    else {
      pRVar1 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_8e8,(TextureLevel *)local_270);
      glu::readPixels(pRVar1,iVar6,iVar7,(PixelBufferAccess *)local_8e8);
    }
    log_00 = program.m_program.m_info.linkTimeUs;
    local_8ec = 0.02;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_918,(TextureLevel *)local_2a0);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_940,(TextureLevel *)local_270);
    local_8ed = tcu::fuzzyCompare((TestLog *)log_00,"Result","Result images",&local_918,&local_940,
                                  local_8ec,COMPARE_LOG_RESULT);
    if ((bool)local_8ed) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
    rnd.m_rnd.z = 1;
    std::
    vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
    ::~vector((vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
               *)&i);
    std::
    vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
    ::~vector((vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
               *)&texCubeBindings.
                  super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    rsg::ProgramExecutor::~ProgramExecutor((ProgramExecutor *)local_338);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2a0);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_270);
    de::Random::~Random((Random *)&viewportHeight);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Failed to compile shader");
    rnd.m_rnd.z = 1;
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
  return STOP;
}

Assistant:

RandomShaderCase::IterateResult RandomShaderCase::iterate (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	// Compile program
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexShader.getSource(), m_fragmentShader.getSource()));
	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
		return STOP;
	}

	// Compute random viewport
	de::Random				rnd				(m_parameters.seed);
	int						viewportWidth	= de::min<int>(VIEWPORT_WIDTH,	m_renderCtx.getRenderTarget().getWidth());
	int						viewportHeight	= de::min<int>(VIEWPORT_HEIGHT,	m_renderCtx.getRenderTarget().getHeight());
	int						viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportWidth);
	int						viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);
	bool					hasAlpha		= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	tcu::TextureLevel		rendered		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);
	tcu::TextureLevel		reference		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);

	// Reference program executor.
	rsg::ProgramExecutor	executor		(reference.getAccess(), m_gridWidth, m_gridHeight);

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Set up attributes
	for (vector<VertexArray>::const_iterator attribIter = m_vertexArrays.begin(); attribIter != m_vertexArrays.end(); attribIter++)
	{
		GLint location = glGetAttribLocation(program.getProgram(), attribIter->getName());

		// Print to log.
		log << tcu::TestLog::Message << "attribute[" << location << "]: " << attribIter->getName() << " = " << attribIter->getValueRange() << tcu::TestLog::EndMessage;

		if (location >= 0)
		{
			glVertexAttribPointer(location, attribIter->getNumComponents(), GL_FLOAT, GL_FALSE, 0, &attribIter->getVertices()[0]);
			glEnableVertexAttribArray(location);
		}
	}
	GLU_CHECK_MSG("After attribute setup");

	// Uniforms
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		GLint location = glGetUniformLocation(program.getProgram(), uniformIter->getVariable()->getName());

		log << tcu::TestLog::Message << "uniform[" << location << "]: " << uniformIter->getVariable()->getName() << " = " << uniformIter->getValue() << tcu::TestLog::EndMessage;

		if (location >= 0)
			setUniformValue(location, uniformIter->getValue());
	}
	GLU_CHECK_MSG("After uniform setup");

	// Textures
	vector<pair<int, const glu::Texture2D*> >	tex2DBindings		= m_texManager.getBindings2D();
	vector<pair<int, const glu::TextureCube*> >	texCubeBindings		= m_texManager.getBindingsCube();

	for (vector<pair<int, const glu::Texture2D*> >::const_iterator i = tex2DBindings.begin(); i != tex2DBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::Texture2D*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_2D, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After 2D texture setup");

	for (vector<pair<int, const glu::TextureCube*> >::const_iterator i = texCubeBindings.begin(); i != texCubeBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::TextureCube*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_CUBE_MAP, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After cubemap setup");

	// Draw and read
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, (GLsizei)m_indices.size(), GL_UNSIGNED_SHORT, &m_indices[0]);
	glFlush();
	GLU_CHECK_MSG("Draw");

	// Render reference while GPU is doing work
	executor.execute(m_vertexShader, m_fragmentShader, m_uniforms);

	if (rendered.getFormat().order != tcu::TextureFormat::RGBA || rendered.getFormat().type != tcu::TextureFormat::UNORM_INT8)
	{
		// Read as GL_RGBA8
		tcu::TextureLevel readBuf(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), rendered.getWidth(), rendered.getHeight());
		glu::readPixels(m_renderCtx, viewportX, viewportY, readBuf.getAccess());
		GLU_CHECK_MSG("Read pixels");
		tcu::copy(rendered, readBuf);
	}
	else
		glu::readPixels(m_renderCtx, viewportX, viewportY, rendered.getAccess());

	// Compare
	{
		float	threshold	= 0.02f;
		bool	imagesOk	= tcu::fuzzyCompare(log, "Result", "Result images", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}